

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  uint *puVar7;
  float *pfVar8;
  Layer *pLVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined4 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined8 uVar28;
  undefined1 uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  undefined4 *puVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  uint _elempack;
  int iVar40;
  ulong uVar41;
  int iVar42;
  float fVar43;
  undefined4 uVar44;
  long lVar45;
  uint uVar46;
  int iVar47;
  undefined1 (*pauVar48) [16];
  undefined1 (*pauVar49) [16];
  Option *opt_00;
  int iVar50;
  float *pfVar51;
  int iVar52;
  bool bVar53;
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  __m128 one;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  int local_320;
  ulong local_308;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  size_t local_2a8;
  float *local_298;
  ulong local_290;
  ulong local_288;
  long local_280;
  Mat local_278;
  Mat local_228;
  ulong local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [56];
  int local_190;
  size_t local_188;
  pointer local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  int local_160;
  Allocator *local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined4 local_140;
  ulong local_138;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined4 local_f0;
  ulong local_e8;
  size_type local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar12;
  undefined3 uVar14;
  undefined2 uVar16;
  undefined4 uVar20;
  undefined3 uVar22;
  undefined2 uVar24;
  
  local_1c8._24_4_ = bottom_blob->elempack;
  local_190 = bottom_blob->c;
  if (local_1c8._24_4_ == 0) {
    bVar53 = false;
  }
  else {
    bVar53 = ((int)bottom_blob->elemsize << 3) / (int)local_1c8._24_4_ == 8;
  }
  iVar40 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar42 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar31 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar3 = bottom_blob->refcount;
  local_1c8._0_8_ = bottom_blob->data;
  local_1c8._8_4_ = SUB84(bottom_blob->refcount,0);
  local_1c8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1c8._16_8_ = bottom_blob->elemsize;
  local_1c8._32_8_ = bottom_blob->allocator;
  local_1c8._40_4_ = bottom_blob->dims;
  local_1c8._44_4_ = bottom_blob->w;
  local_1c8._48_4_ = bottom_blob->h;
  local_1c8._52_4_ = bottom_blob->d;
  local_188 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (!bVar53) {
    uVar38 = (long)(local_1c8._24_4_ * local_190) / (long)(this->super_ConvolutionDepthWise).group;
    local_278.cstep = 0;
    local_278.data = (undefined4 *)0x0;
    local_278.refcount._0_4_ = 0;
    local_278.refcount._4_4_ = 0;
    local_278.elemsize = 0;
    local_278.elempack = 0;
    local_278.allocator = (Allocator *)0x0;
    local_278.dims = 0;
    local_278.w = 0;
    local_278.h = 0;
    local_278.d = 0;
    local_278.c = 0;
    Mat::create(&local_278,local_1c8._24_4_ * local_190,4,(Allocator *)0x0);
    lVar33 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar33) {
      pvVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar45 = 0;
      puVar35 = (undefined4 *)local_278.data;
      do {
        if (0 < (int)uVar38) {
          uVar44 = *(undefined4 *)((long)pvVar4 + lVar45 * 4);
          uVar36 = uVar38 & 0xffffffff;
          do {
            *puVar35 = uVar44;
            puVar35 = puVar35 + 1;
            uVar46 = (int)uVar36 - 1;
            uVar36 = (ulong)uVar46;
          } while (uVar46 != 0);
        }
        lVar45 = lVar45 + 1;
      } while (lVar45 != lVar33);
    }
    local_2e8._0_8_ = *(undefined8 *)opt;
    uVar10 = opt->openmp_blocktime;
    uVar11 = opt->use_winograd_convolution;
    uVar13 = opt->use_sgemm_convolution;
    uVar15 = opt->use_int8_inference;
    uVar17 = opt->use_vulkan_compute;
    uVar16 = CONCAT11(uVar17,uVar15);
    uVar14 = CONCAT21(uVar16,uVar13);
    uVar12 = CONCAT31(uVar14,uVar11);
    local_2c8[0] = opt->use_bf16_storage;
    local_2c8[1] = opt->use_fp16_packed;
    local_2c8[2] = opt->use_fp16_storage;
    local_2c8[3] = opt->use_fp16_arithmetic;
    local_2c8[4] = opt->use_int8_packed;
    local_2c8[5] = opt->use_int8_storage;
    local_2c8[6] = opt->use_int8_arithmetic;
    local_2c8[7] = opt->use_packing_layout;
    local_2c8._8_4_ = opt->vulkan_device_index;
    local_2c8[0xc] = opt->use_reserved_1;
    local_2c8[0xd] = opt->use_image_storage;
    local_2c8[0xe] = opt->use_tensor_storage;
    local_2c8[0xf] = opt->use_reserved_2;
    local_2c8._16_4_ = opt->flush_denormals;
    local_2c8[0x14] = opt->use_local_pool_allocator;
    local_2c8[0x15] = opt->use_shader_local_memory;
    local_2c8[0x16] = opt->use_cooperative_matrix;
    local_2c8[0x17] = opt->use_winograd23_convolution;
    local_2c8[0x18] = opt->use_winograd43_convolution;
    local_2c8[0x19] = opt->use_winograd63_convolution;
    local_2c8[0x1a] = opt->use_a53_a55_optimized_kernel;
    local_2c8[0x1b] = opt->use_fp16_uniform;
    local_2c8[0x1c] = opt->use_int8_uniform;
    local_2c8[0x1d] = opt->use_reserved_9;
    local_2c8[0x1e] = opt->use_reserved_10;
    local_2c8[0x1f] = opt->use_reserved_11;
    local_2e8._16_4_ = SUB84(opt->workspace_allocator,0);
    local_2e8._20_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_2e8._8_4_ = SUB84(opt->workspace_allocator,0);
    local_2e8._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_2e8._24_4_ = uVar10;
    local_2e8._28_4_ = uVar12;
    quantize_to_int8(bottom_blob,(Mat *)local_1c8,&local_278,(Option *)local_2e8);
    bVar53 = (void *)local_1c8._0_8_ == (void *)0x0;
    lVar33 = (long)local_190 * local_188;
    piVar3 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_278.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_278.data != (undefined4 *)0x0) {
            free(local_278.data);
          }
        }
        else {
          (*(local_278.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_320 = -100;
    if (bVar53 || lVar33 == 0) goto LAB_0041ef0e;
  }
  local_278.cstep = 0;
  local_278.data = (pointer)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  ConvolutionDepthWise::make_padding
            (&this->super_ConvolutionDepthWise,(Mat *)local_1c8,&local_278,opt);
  iVar32 = local_278.c;
  iVar52 = local_278.elempack;
  if (((pointer)local_278.data == (pointer)0x0) || ((long)local_278.c * local_278.cstep == 0)) {
    local_320 = -100;
  }
  else {
    uVar36 = (ulong)(uint)local_278.c;
    iVar40 = (~((iVar40 + -1) * iVar42) + local_278.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar42 = iVar40 + 1;
    uVar38 = (long)(~((iVar50 + -1) * iVar31) + local_278.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_1d0 = uVar38 & 0xffffffff;
    iVar50 = (int)uVar38 + 1;
    uVar39 = local_278.c * local_278.elempack;
    uVar46 = (this->super_ConvolutionDepthWise).group;
    if ((uVar39 == uVar46) &&
       (uVar30 = (this->super_ConvolutionDepthWise).num_output, uVar46 == uVar30)) {
      local_280 = CONCAT44(local_280._4_4_,local_278.w);
      local_320 = -100;
      uVar46 = 8;
      if (opt->use_packing_layout == false) {
        uVar46 = 1;
      }
      if ((uVar30 & 7) != 0) {
        uVar46 = 1;
      }
      iVar31 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar39 = uVar46 * 4;
      if (100 < iVar31) {
        uVar39 = uVar46;
      }
      Mat::create(top_blob,iVar42,iVar50,(int)uVar30 / (int)uVar46,(ulong)uVar39,uVar46,
                  opt->blob_allocator);
      local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
      if ((top_blob->data != (void *)0x0) &&
         (local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_),
         (long)top_blob->c * top_blob->cstep != 0)) {
        if (iVar52 == 1) {
          iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
          uVar46 = (this->super_ConvolutionDepthWise).kernel_h;
          opt_00 = (Option *)(ulong)uVar46;
          auVar118._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
          auVar118._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
          auVar118._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
          auVar118._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
          auVar192._8_4_ = 1;
          auVar192._0_8_ = 0x100000001;
          auVar192._12_4_ = 1;
          uVar39 = (this->super_ConvolutionDepthWise).activation_type;
          auVar96._0_8_ = auVar118._0_8_ ^ 0x100000001;
          auVar96._8_4_ = auVar118._8_4_ ^ 1;
          auVar96._12_4_ = auVar118._12_4_ ^ 1;
          if ((1 < uVar39 || (uVar46 != 3 || iVar50 != 3)) || auVar96 != (undefined1  [16])0x0) {
            auVar192 = vpcmpeqd_avx(auVar118,auVar192);
            uVar44 = vmovmskps_avx(auVar192);
            if (((uVar46 == 3 && iVar50 == 3) && uVar39 < 2) &&
                ((auVar118._12_4_ == 2 && auVar118._8_4_ == 2) && (~(byte)uVar44 & 3) == 0)) {
              if (iVar31 < 0x65) {
                local_2e8._0_8_ = (pointer)0x0;
                local_2e8._8_8_ = (Allocator *)0x0;
                local_2e8._16_4_ = 0;
                local_2e8._20_4_ = 0;
                if (0 < (this->super_ConvolutionDepthWise).group) {
                  lVar33 = 0;
                  local_2e8._8_8_ = (float *)0x0;
                  do {
                    fVar43 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                     weight_data_int8_scales.data + lVar33 * 4) *
                                   *(float *)((long)(this->super_ConvolutionDepthWise).
                                                    bottom_blob_int8_scales.data + lVar33 * 4));
                    local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar43);
                    if ((float *)local_2e8._8_8_ ==
                        (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                ((vector<float,std::allocator<float>> *)local_2e8,
                                 (iterator)local_2e8._8_8_,(float *)&local_228);
                    }
                    else {
                      *(float *)local_2e8._8_8_ = fVar43;
                      local_2e8._8_8_ = local_2e8._8_8_ + 4;
                    }
                    lVar33 = lVar33 + 1;
                  } while (lVar33 < (this->super_ConvolutionDepthWise).group);
                }
                std::vector<float,_std::allocator<float>_>::vector
                          (&local_d8,(vector<float,_std::allocator<float>_> *)local_2e8);
                convdw3x3s2_int8_dequant_sse
                          (&local_278,top_blob,&this->weight_data_tm,
                           &(this->super_ConvolutionDepthWise).bias_data,&local_d8,opt_00);
                goto joined_r0x0041fe39;
              }
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (Allocator *)0x0;
              local_2e8._16_4_ = 0;
              local_2e8._20_4_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar33 = 0;
                local_2e8._8_8_ = (float *)0x0;
                do {
                  fVar43 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar33 * 4);
                  fVar54 = 0.0;
                  if (fVar43 != 0.0) {
                    fVar54 = 1.0 / (fVar43 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar33 * 4));
                  }
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar54);
                  local_178 = (pointer)CONCAT44(local_178._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar33 * 4));
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = fVar54;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_178);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = local_178._0_4_;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)local_2e8);
              convdw3x3s2_int8_requant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_c0,opt_00);
              goto joined_r0x0041f7d9;
            }
            local_320 = 0;
            uVar46 = uVar46 * iVar50;
            local_e0 = (size_type)(int)uVar46;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_2e8,local_e0,
                       (allocator_type *)&local_228);
            uVar26 = local_2e8._0_8_;
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar50 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar42 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar52 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar32 = 0;
              fVar43 = 0.0;
              iVar37 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar33 = 0;
                  do {
                    *(float *)(local_2e8._0_8_ + (iVar37 + lVar33) * 4) = fVar43;
                    fVar43 = (float)((int)fVar43 + (this->super_ConvolutionDepthWise).dilation_w);
                    lVar33 = lVar33 + 1;
                  } while ((int)lVar33 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar37 = iVar37 + (int)lVar33;
                }
                fVar43 = (float)((int)fVar43 + ((int)local_280 * iVar50 - iVar42 * iVar52));
                iVar32 = iVar32 + 1;
              } while (iVar32 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < (this->super_ConvolutionDepthWise).group) {
              local_280 = 0;
              auVar100 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              uVar38 = 0;
              do {
                pvVar4 = local_278.data;
                lVar33 = local_280;
                if (-1 < (int)local_1d0) {
                  lVar45 = local_278.cstep * uVar38 * local_278.elemsize;
                  pfVar51 = (float *)(top_blob->elemsize * uVar38 * top_blob->cstep +
                                     (long)top_blob->data);
                  local_288 = (long)local_278.w * local_278.elemsize;
                  pvVar5 = (this->weight_data_tm).data;
                  local_1d8 = 0;
                  local_298 = pfVar51;
                  local_290 = uVar38;
                  do {
                    if (-1 < iVar40) {
                      lVar34 = (long)(int)local_1d8;
                      iVar50 = 0;
                      do {
                        fVar43 = 0.0;
                        fVar54 = 0.0;
                        if (0 < (int)uVar46) {
                          uVar36 = 0;
                          iVar42 = 0;
                          do {
                            iVar42 = iVar42 + (int)*(char *)((long)pvVar5 + uVar36 + lVar33) *
                                              (int)*(char *)((long)pvVar4 +
                                                            (long)(int)*(pointer)(uVar26 + uVar36 * 
                                                  4) + (this->super_ConvolutionDepthWise).stride_h *
                                                       lVar34 * local_288 +
                                                       (long)iVar50 *
                                                       (long)(this->super_ConvolutionDepthWise).
                                                             stride_w + lVar45);
                            uVar36 = uVar36 + 1;
                          } while (uVar46 != uVar36);
                          fVar54 = (float)iVar42;
                        }
                        fVar1 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + uVar38 * 4);
                        if (fVar1 != 0.0) {
                          fVar43 = 1.0 / (fVar1 * *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            uVar38 * 4));
                        }
                        fVar43 = fVar43 * fVar54;
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          fVar43 = fVar43 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                             bias_data.data + uVar38 * 4);
                        }
                        auVar118 = ZEXT416((uint)fVar43);
                        fVar54 = fVar43;
                        switch((this->super_ConvolutionDepthWise).activation_type) {
                        case 1:
                          auVar118 = vmaxss_avx(auVar118,ZEXT416(0));
                          fVar54 = auVar118._0_4_;
                          break;
                        case 2:
                          auVar118 = vcmpss_avx(ZEXT816(0) << 0x20,auVar118,1);
                          auVar98._8_4_ = 0x3f800000;
                          auVar98._0_8_ = 0x3f8000003f800000;
                          auVar98._12_4_ = 0x3f800000;
                          auVar118 = vblendvps_avx(ZEXT416(*(this->super_ConvolutionDepthWise).
                                                            activation_params.data),auVar98,auVar118
                                                  );
                          fVar54 = auVar118._0_4_ * fVar43;
                          break;
                        case 3:
                          puVar7 = (uint *)(this->super_ConvolutionDepthWise).activation_params.data
                          ;
                          fVar43 = (float)puVar7[1];
                          auVar118 = vmaxss_avx(auVar118,ZEXT416(*puVar7));
                          fVar54 = auVar118._0_4_;
                          if (fVar43 < auVar118._0_4_) {
                            fVar54 = fVar43;
                          }
                          break;
                        case 4:
                          auVar118 = vminss_avx(auVar118,ZEXT416(0x42b0c0a5));
                          auVar91._0_4_ = auVar118._0_4_ ^ auVar100._0_4_;
                          auVar91._4_4_ = auVar118._4_4_ ^ auVar100._4_4_;
                          auVar91._8_4_ = auVar118._8_4_ ^ auVar100._8_4_;
                          auVar91._12_4_ = auVar118._12_4_ ^ auVar100._12_4_;
                          auVar118 = vcmpss_avx(auVar118,ZEXT416(0xc2b0c0a5),1);
                          auVar97._8_4_ = 0x42b0c0a5;
                          auVar97._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar97._12_4_ = 0x42b0c0a5;
                          auVar118 = vblendvps_avx(auVar91,auVar97,auVar118);
                          fVar43 = expf(auVar118._0_4_);
                          auVar100 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          uVar38 = local_290;
                          fVar54 = 1.0 / (fVar43 + 1.0);
                          break;
                        case 5:
                          fVar54 = expf(fVar43);
                          fVar54 = logf(fVar54 + 1.0);
                          fVar54 = tanhf(fVar54);
                          auVar100 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          uVar38 = local_290;
                          fVar54 = fVar54 * fVar43;
                          break;
                        case 6:
                          pfVar8 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                            data;
                          fVar1 = *pfVar8;
                          fVar2 = pfVar8[1];
                          fVar101 = (float)((uint)fVar2 ^ auVar100._0_4_) / fVar1;
                          fVar54 = 0.0;
                          if ((fVar101 <= fVar43) &&
                             (fVar54 = fVar43, fVar43 <= fVar101 + 1.0 / fVar1)) {
                            auVar118 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar118,
                                                       ZEXT416((uint)fVar2));
                            fVar54 = auVar118._0_4_ * fVar43;
                          }
                        }
                        if (iVar31 < 0x65) {
                          *pfVar51 = fVar54;
                          pfVar51 = pfVar51 + 1;
                        }
                        else {
                          fVar54 = fVar54 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                             top_blob_int8_scales.data + uVar38 * 4)
                          ;
                          auVar118 = vandps_avx(ZEXT416((uint)fVar54),auVar100._0_16_);
                          auVar99._8_4_ = 0x3effffff;
                          auVar99._0_8_ = 0x3effffff3effffff;
                          auVar99._12_4_ = 0x3effffff;
                          auVar118 = vorps_avx(auVar118,auVar99);
                          auVar118 = ZEXT416((uint)(fVar54 + auVar118._0_4_));
                          auVar118 = vroundss_avx(auVar118,auVar118,0xb);
                          iVar42 = (int)auVar118._0_4_;
                          if (iVar42 < -0x7e) {
                            iVar42 = -0x7f;
                          }
                          uVar29 = (undefined1)iVar42;
                          if (0x7e < iVar42) {
                            uVar29 = 0x7f;
                          }
                          *(undefined1 *)local_298 = uVar29;
                          local_298 = (float *)((long)local_298 + 1);
                        }
                        bVar53 = iVar50 != iVar40;
                        iVar50 = iVar50 + 1;
                      } while (bVar53);
                    }
                    iVar50 = (int)local_1d8;
                    local_1d8 = (ulong)(iVar50 + 1);
                  } while (iVar50 != (int)local_1d0);
                }
                uVar38 = uVar38 + 1;
                local_280 = local_280 + local_e0;
              } while ((long)uVar38 < (long)(this->super_ConvolutionDepthWise).group);
            }
            if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2e8._0_8_,
                              CONCAT44(local_2e8._20_4_,local_2e8._16_4_) - local_2e8._0_8_);
            }
            local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
          }
          else {
            if (iVar31 < 0x65) {
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (Allocator *)0x0;
              local_2e8._16_4_ = 0;
              local_2e8._20_4_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar33 = 0;
                local_2e8._8_8_ = (float *)0x0;
                do {
                  fVar43 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar33 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar33 * 4));
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar43);
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = fVar43;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_a8,(vector<float,_std::allocator<float>_> *)local_2e8);
              convdw3x3s1_int8_dequant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_a8,opt_00);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0041fe39:
              if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (Allocator *)0x0;
              local_2e8._16_4_ = 0;
              local_2e8._20_4_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar33 = 0;
                local_2e8._8_8_ = (float *)0x0;
                do {
                  fVar43 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar33 * 4);
                  fVar54 = 0.0;
                  if (fVar43 != 0.0) {
                    fVar54 = 1.0 / (fVar43 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar33 * 4));
                  }
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar54);
                  local_178 = (pointer)CONCAT44(local_178._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar33 * 4));
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = fVar54;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_178);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = local_178._0_4_;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_90,(vector<float,_std::allocator<float>_> *)local_2e8);
              convdw3x3s1_int8_requant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_90,opt_00);
              local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0041f7d9:
              if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            local_320 = 0;
            if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2e8._0_8_,
                              CONCAT44(local_2e8._20_4_,local_2e8._16_4_) - local_2e8._0_8_);
            }
            pLVar9 = this->activation;
            if (pLVar9 != (Layer *)0x0) {
              (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
            }
          }
        }
        else {
          if (iVar52 == 8) {
            uVar38 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                     (long)(this->super_ConvolutionDepthWise).kernel_w;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_2e8,uVar38,
                       (allocator_type *)&local_228);
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar50 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar42 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar52 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar37 = 0;
              fVar43 = 0.0;
              iVar47 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar33 = 0;
                  do {
                    *(float *)(local_2e8._0_8_ + (iVar37 + lVar33) * 4) = fVar43;
                    fVar43 = (float)((int)fVar43 + (this->super_ConvolutionDepthWise).dilation_w);
                    lVar33 = lVar33 + 1;
                  } while ((int)lVar33 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar37 = iVar37 + (int)lVar33;
                }
                fVar43 = (float)((int)fVar43 + (iVar50 * (int)local_280 - iVar42 * iVar52));
                iVar47 = iVar47 + 1;
              } while (iVar47 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < iVar32) {
              local_290 = 0;
              auVar182 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar100 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
              auVar167._8_4_ = 0x3f800000;
              auVar167._0_8_ = 0x3f8000003f800000;
              auVar167._12_4_ = 0x3f800000;
              local_308 = 0;
              do {
                if (-1 < (int)local_1d0) {
                  local_298 = (float *)(local_278.cstep * local_308 * local_278.elemsize +
                                       (long)local_278.data);
                  pauVar48 = (undefined1 (*) [16])
                             (top_blob->elemsize * local_308 * top_blob->cstep +
                             (long)top_blob->data);
                  pvVar4 = (this->weight_data_tm).data;
                  uVar41 = 0;
                  pauVar49 = pauVar48;
                  do {
                    local_288 = uVar41;
                    iVar50 = (int)local_288;
                    if (-1 < iVar40) {
                      iVar42 = 0;
                      do {
                        if ((int)uVar38 < 1) {
                          auVar192 = ZEXT816(0) << 0x40;
                          auVar118 = ZEXT816(0) << 0x40;
                        }
                        else {
                          auVar108 = ZEXT1664((undefined1  [16])0x0);
                          uVar41 = 0;
                          auVar115 = ZEXT1664((undefined1  [16])0x0);
                          do {
                            auVar116._8_8_ = 0;
                            auVar116._0_8_ =
                                 *(ulong *)((long)local_298 +
                                           (long)(int)*(pointer)(local_2e8._0_8_ + uVar41 * 4) * 8 +
                                           (long)(this->super_ConvolutionDepthWise).stride_h *
                                           (long)iVar50 * (long)local_278.w * local_278.elemsize +
                                           (long)((this->super_ConvolutionDepthWise).stride_w *
                                                  iVar42 * 8));
                            auVar118 = vpcmpgtb_avx((undefined1  [16])0x0,auVar116);
                            auVar192 = vpunpcklbw_avx(auVar116,auVar118);
                            auVar132._8_8_ = 0;
                            auVar132._0_8_ =
                                 *(ulong *)((long)pvVar4 + uVar41 * 8 + (long)(int)local_290);
                            auVar118 = vpcmpgtb_avx((undefined1  [16])0x0,auVar132);
                            auVar118 = vpunpcklbw_avx(auVar132,auVar118);
                            auVar96 = vpmullw_avx(auVar118,auVar192);
                            auVar192 = vpmulhw_avx(auVar192,auVar118);
                            auVar118 = vpunpcklwd_avx(auVar96,auVar192);
                            auVar118 = vpaddd_avx(auVar108._0_16_,auVar118);
                            auVar108 = ZEXT1664(auVar118);
                            auVar192 = vpunpckhwd_avx(auVar96,auVar192);
                            auVar192 = vpaddd_avx(auVar115._0_16_,auVar192);
                            auVar115 = ZEXT1664(auVar192);
                            uVar41 = uVar41 + 1;
                          } while ((uVar38 & 0xffffffff) != uVar41);
                          auVar118 = vcvtdq2ps_avx(auVar118);
                          auVar192 = vcvtdq2ps_avx(auVar192);
                        }
                        pvVar5 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                        pvVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                        auVar96 = *(undefined1 (*) [16])((long)pvVar5 + local_308 * 0x20);
                        auVar91 = *(undefined1 (*) [16])((long)pvVar5 + local_308 * 0x20 + 0x10);
                        pfVar51 = (float *)((long)pvVar6 + local_308 * 0x20);
                        auVar188._0_4_ = auVar96._0_4_ * *pfVar51;
                        auVar188._4_4_ = auVar96._4_4_ * pfVar51[1];
                        auVar188._8_4_ = auVar96._8_4_ * pfVar51[2];
                        auVar188._12_4_ = auVar96._12_4_ * pfVar51[3];
                        auVar97 = vrcpps_avx(auVar188);
                        pfVar51 = (float *)((long)pvVar6 + local_308 * 0x20 + 0x10);
                        auVar200._0_4_ = auVar91._0_4_ * *pfVar51;
                        auVar200._4_4_ = auVar91._4_4_ * pfVar51[1];
                        auVar200._8_4_ = auVar91._8_4_ * pfVar51[2];
                        auVar200._12_4_ = auVar91._12_4_ * pfVar51[3];
                        auVar98 = vrcpps_avx(auVar200);
                        auVar96 = vcmpps_avx(auVar96,(undefined1  [16])0x0,4);
                        auVar96 = vandps_avx(auVar97,auVar96);
                        auVar102._0_4_ = auVar96._0_4_ * auVar118._0_4_;
                        auVar102._4_4_ = auVar96._4_4_ * auVar118._4_4_;
                        auVar102._8_4_ = auVar96._8_4_ * auVar118._8_4_;
                        auVar102._12_4_ = auVar96._12_4_ * auVar118._12_4_;
                        auVar118 = vcmpps_avx(auVar91,(undefined1  [16])0x0,4);
                        auVar118 = vandps_avx(auVar98,auVar118);
                        auVar109._0_4_ = auVar118._0_4_ * auVar192._0_4_;
                        auVar109._4_4_ = auVar118._4_4_ * auVar192._4_4_;
                        auVar109._8_4_ = auVar118._8_4_ * auVar192._8_4_;
                        auVar109._12_4_ = auVar118._12_4_ * auVar192._12_4_;
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          pvVar5 = (this->super_ConvolutionDepthWise).bias_data.data;
                          pfVar51 = (float *)((long)pvVar5 + local_308 * 0x20);
                          auVar102._0_4_ = auVar102._0_4_ + *pfVar51;
                          auVar102._4_4_ = auVar102._4_4_ + pfVar51[1];
                          auVar102._8_4_ = auVar102._8_4_ + pfVar51[2];
                          auVar102._12_4_ = auVar102._12_4_ + pfVar51[3];
                          pfVar51 = (float *)((long)pvVar5 + local_308 * 0x20 + 0x10);
                          auVar109._0_4_ = auVar109._0_4_ + *pfVar51;
                          auVar109._4_4_ = auVar109._4_4_ + pfVar51[1];
                          auVar109._8_4_ = auVar109._8_4_ + pfVar51[2];
                          auVar109._12_4_ = auVar109._12_4_ + pfVar51[3];
                        }
                        iVar52 = (this->super_ConvolutionDepthWise).activation_type + -1;
                        auVar118 = auVar100._0_16_;
                        fVar43 = auVar102._4_4_;
                        fVar54 = auVar102._8_4_;
                        fVar1 = auVar102._12_4_;
                        switch(iVar52) {
                        case 0:
                          auVar102 = vmaxps_avx(auVar102,(undefined1  [16])0x0);
                          break;
                        case 1:
                          auVar118 = vmaxps_avx(auVar102,(undefined1  [16])0x0);
                          auVar192 = vminps_avx(auVar102,(undefined1  [16])0x0);
                          uVar44 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar105._4_4_ = uVar44;
                          auVar105._0_4_ = uVar44;
                          auVar105._8_4_ = uVar44;
                          auVar105._12_4_ = uVar44;
                          auVar102 = vfmadd213ps_fma(auVar105,auVar192,auVar118);
                          break;
                        case 2:
                          puVar35 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar44 = *puVar35;
                          auVar120._4_4_ = uVar44;
                          auVar120._0_4_ = uVar44;
                          auVar120._8_4_ = uVar44;
                          auVar120._12_4_ = uVar44;
                          uVar44 = puVar35[1];
                          auVar138._4_4_ = uVar44;
                          auVar138._0_4_ = uVar44;
                          auVar138._8_4_ = uVar44;
                          auVar138._12_4_ = uVar44;
                          auVar118 = vmaxps_avx(auVar102,auVar120);
                          auVar102 = vminps_avx(auVar118,auVar138);
                          break;
                        case 3:
                          auVar103._0_4_ = auVar182._0_4_ ^ (uint)auVar102._0_4_;
                          auVar103._4_4_ = auVar182._4_4_ ^ (uint)fVar43;
                          auVar103._8_4_ = auVar182._8_4_ ^ (uint)fVar54;
                          auVar103._12_4_ = auVar182._12_4_ ^ (uint)fVar1;
                          auVar75._8_4_ = 0x42b0c0a5;
                          auVar75._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar75._12_4_ = 0x42b0c0a5;
                          auVar192 = vminps_avx(auVar103,auVar75);
                          auVar121._8_4_ = 0xc2b0c0a5;
                          auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar121._12_4_ = 0xc2b0c0a5;
                          auVar91 = vmaxps_avx(auVar192,auVar121);
                          auVar122._8_4_ = 0x3fb8aa3b;
                          auVar122._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar122._12_4_ = 0x3fb8aa3b;
                          auVar192 = vfmadd213ps_fma(auVar122,auVar91,auVar118);
                          auVar139._0_4_ = (int)auVar192._0_4_;
                          auVar139._4_4_ = (int)auVar192._4_4_;
                          auVar139._8_4_ = (int)auVar192._8_4_;
                          auVar139._12_4_ = (int)auVar192._12_4_;
                          auVar96 = vcvtdq2ps_avx(auVar139);
                          auVar192 = vcmpps_avx(auVar192,auVar96,1);
                          auVar192 = vandps_avx(auVar167,auVar192);
                          auVar192 = vsubps_avx(auVar96,auVar192);
                          auVar76._8_4_ = 0x3f318000;
                          auVar76._0_8_ = 0x3f3180003f318000;
                          auVar76._12_4_ = 0x3f318000;
                          auVar96 = vfmsub231ps_fma(auVar91,auVar192,auVar76);
                          auVar140._8_4_ = 0x395e8083;
                          auVar140._0_8_ = 0x395e8083395e8083;
                          auVar140._12_4_ = 0x395e8083;
                          auVar91 = vfmsub231ps_fma(auVar96,auVar192,auVar140);
                          auVar141._0_4_ = auVar91._0_4_ * auVar91._0_4_;
                          auVar141._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                          auVar141._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                          auVar141._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                          auVar194._8_4_ = 0x39506967;
                          auVar194._0_8_ = 0x3950696739506967;
                          auVar194._12_4_ = 0x39506967;
                          auVar158._8_4_ = 0x3ab743ce;
                          auVar158._0_8_ = 0x3ab743ce3ab743ce;
                          auVar158._12_4_ = 0x3ab743ce;
                          auVar96 = vfmadd213ps_fma(auVar194,auVar91,auVar158);
                          auVar77._8_4_ = 0x3c088908;
                          auVar77._0_8_ = 0x3c0889083c088908;
                          auVar77._12_4_ = 0x3c088908;
                          auVar96 = vfmadd213ps_fma(auVar96,auVar91,auVar77);
                          auVar78._8_4_ = 0x3d2aa9c1;
                          auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar78._12_4_ = 0x3d2aa9c1;
                          auVar96 = vfmadd213ps_fma(auVar96,auVar91,auVar78);
                          auVar79._8_4_ = 0x3e2aaaaa;
                          auVar79._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar79._12_4_ = 0x3e2aaaaa;
                          auVar96 = vfmadd213ps_fma(auVar96,auVar91,auVar79);
                          auVar118 = vfmadd213ps_fma(auVar96,auVar91,auVar118);
                          auVar118 = vfmadd213ps_fma(auVar118,auVar141,auVar91);
                          auVar104._0_4_ = auVar118._0_4_ + 1.0;
                          auVar104._4_4_ = auVar118._4_4_ + 1.0;
                          auVar104._8_4_ = auVar118._8_4_ + 1.0;
                          auVar104._12_4_ = auVar118._12_4_ + 1.0;
                          auVar123._0_4_ = (int)auVar192._0_4_;
                          auVar123._4_4_ = (int)auVar192._4_4_;
                          auVar123._8_4_ = (int)auVar192._8_4_;
                          auVar123._12_4_ = (int)auVar192._12_4_;
                          auVar118 = vpslld_avx(auVar123,0x17);
                          auVar118 = vpaddd_avx(auVar167,auVar118);
                          auVar118 = vfmadd213ps_fma(auVar118,auVar104,auVar167);
                          auVar102 = vdivps_avx(auVar167,auVar118);
                          break;
                        case 4:
                          auVar55._8_4_ = 0x42b0c0a5;
                          auVar55._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar55._12_4_ = 0x42b0c0a5;
                          auVar192 = vminps_avx(auVar102,auVar55);
                          auVar210._8_4_ = 0xc2b0c0a5;
                          auVar210._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar210._12_4_ = 0xc2b0c0a5;
                          auVar96 = vmaxps_avx(auVar210,auVar192);
                          auVar133._8_4_ = 0x3fb8aa3b;
                          auVar133._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar133._12_4_ = 0x3fb8aa3b;
                          auVar118 = vfmadd213ps_fma(auVar133,auVar96,auVar118);
                          auVar189._0_4_ = (int)auVar118._0_4_;
                          auVar189._4_4_ = (int)auVar118._4_4_;
                          auVar189._8_4_ = (int)auVar118._8_4_;
                          auVar189._12_4_ = (int)auVar118._12_4_;
                          auVar192 = vcvtdq2ps_avx(auVar189);
                          auVar118 = vcmpps_avx(auVar118,auVar192,1);
                          auVar118 = vandps_avx(auVar167,auVar118);
                          auVar118 = vsubps_avx(auVar192,auVar118);
                          auVar198._8_4_ = 0x3f318000;
                          auVar198._0_8_ = 0x3f3180003f318000;
                          auVar198._12_4_ = 0x3f318000;
                          auVar192 = vfmsub231ps_fma(auVar96,auVar118,auVar198);
                          auVar92._8_4_ = 0xb95e8083;
                          auVar92._0_8_ = 0xb95e8083b95e8083;
                          auVar92._12_4_ = 0xb95e8083;
                          auVar96 = vfnmsub231ps_fma(auVar192,auVar118,auVar92);
                          auVar190._0_4_ = auVar96._0_4_ * auVar96._0_4_;
                          auVar190._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                          auVar190._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                          auVar190._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                          auVar168._8_4_ = 0x39506967;
                          auVar168._0_8_ = 0x3950696739506967;
                          auVar168._12_4_ = 0x39506967;
                          auVar183._8_4_ = 0x3ab743ce;
                          auVar183._0_8_ = 0x3ab743ce3ab743ce;
                          auVar183._12_4_ = 0x3ab743ce;
                          auVar192 = vfmadd213ps_fma(auVar168,auVar96,auVar183);
                          auVar184._8_4_ = 0x3c088908;
                          auVar184._0_8_ = 0x3c0889083c088908;
                          auVar184._12_4_ = 0x3c088908;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar184);
                          auVar152._8_4_ = 0x3d2aa9c1;
                          auVar152._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar152._12_4_ = 0x3d2aa9c1;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar152);
                          auVar153._8_4_ = 0x3e2aaaaa;
                          auVar153._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar153._12_4_ = 0x3e2aaaaa;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar153);
                          auVar154._8_4_ = 0x3f000000;
                          auVar154._0_8_ = 0x3f0000003f000000;
                          auVar154._12_4_ = 0x3f000000;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar154);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar190,auVar96);
                          auVar191._0_4_ = auVar192._0_4_ + 1.0;
                          auVar191._4_4_ = auVar192._4_4_ + 1.0;
                          auVar191._8_4_ = auVar192._8_4_ + 1.0;
                          auVar191._12_4_ = auVar192._12_4_ + 1.0;
                          auVar117._0_4_ = (int)auVar118._0_4_;
                          auVar117._4_4_ = (int)auVar118._4_4_;
                          auVar117._8_4_ = (int)auVar118._8_4_;
                          auVar117._12_4_ = (int)auVar118._12_4_;
                          auVar118 = vpslld_avx(auVar117,0x17);
                          auVar118 = vpaddd_avx(auVar167,auVar118);
                          auVar97 = vfmadd213ps_fma(auVar118,auVar191,auVar167);
                          auVar56._8_4_ = 0x800000;
                          auVar56._0_8_ = 0x80000000800000;
                          auVar56._12_4_ = 0x800000;
                          auVar118 = vmaxps_avx(auVar97,auVar56);
                          auVar192 = vpsrld_avx(auVar118,0x17);
                          auVar57._8_4_ = 0x807fffff;
                          auVar57._0_8_ = 0x807fffff807fffff;
                          auVar57._12_4_ = 0x807fffff;
                          auVar118 = vandps_avx(auVar118,auVar57);
                          auVar58._8_4_ = 0x3f000000;
                          auVar58._0_8_ = 0x3f0000003f000000;
                          auVar58._12_4_ = 0x3f000000;
                          auVar91 = vorps_avx(auVar118,auVar58);
                          auVar59._8_4_ = 0xffffff82;
                          auVar59._0_8_ = 0xffffff82ffffff82;
                          auVar59._12_4_ = 0xffffff82;
                          auVar118 = vpaddd_avx(auVar192,auVar59);
                          auVar96 = vcvtdq2ps_avx(auVar118);
                          auVar60._8_4_ = 0x3f3504f3;
                          auVar60._0_8_ = 0x3f3504f33f3504f3;
                          auVar60._12_4_ = 0x3f3504f3;
                          auVar192 = vcmpps_avx(auVar91,auVar60,1);
                          auVar118 = vandps_avx(auVar192,auVar91);
                          auVar134._0_4_ = auVar91._0_4_ + -1.0 + auVar118._0_4_;
                          auVar134._4_4_ = auVar91._4_4_ + -1.0 + auVar118._4_4_;
                          auVar134._8_4_ = auVar91._8_4_ + -1.0 + auVar118._8_4_;
                          auVar134._12_4_ = auVar91._12_4_ + -1.0 + auVar118._12_4_;
                          auVar118 = vandps_avx(auVar192,auVar167);
                          auVar192 = vsubps_avx(auVar96,auVar118);
                          auVar193._0_4_ = auVar134._0_4_ * auVar134._0_4_;
                          auVar193._4_4_ = auVar134._4_4_ * auVar134._4_4_;
                          auVar193._8_4_ = auVar134._8_4_ * auVar134._8_4_;
                          auVar193._12_4_ = auVar134._12_4_ * auVar134._12_4_;
                          auVar201._8_4_ = 0x3d9021bb;
                          auVar201._0_8_ = 0x3d9021bb3d9021bb;
                          auVar201._12_4_ = 0x3d9021bb;
                          auVar61._8_4_ = 0xbdebd1b8;
                          auVar61._0_8_ = 0xbdebd1b8bdebd1b8;
                          auVar61._12_4_ = 0xbdebd1b8;
                          auVar118 = vfmadd213ps_fma(auVar201,auVar134,auVar61);
                          auVar62._8_4_ = 0x3def251a;
                          auVar62._0_8_ = 0x3def251a3def251a;
                          auVar62._12_4_ = 0x3def251a;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar62);
                          auVar63._8_4_ = 0xbdfe5d4f;
                          auVar63._0_8_ = 0xbdfe5d4fbdfe5d4f;
                          auVar63._12_4_ = 0xbdfe5d4f;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar63);
                          auVar64._8_4_ = 0x3e11e9bf;
                          auVar64._0_8_ = 0x3e11e9bf3e11e9bf;
                          auVar64._12_4_ = 0x3e11e9bf;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar64);
                          auVar65._8_4_ = 0xbe2aae50;
                          auVar65._0_8_ = 0xbe2aae50be2aae50;
                          auVar65._12_4_ = 0xbe2aae50;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar65);
                          auVar66._8_4_ = 0x3e4cceac;
                          auVar66._0_8_ = 0x3e4cceac3e4cceac;
                          auVar66._12_4_ = 0x3e4cceac;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar66);
                          auVar67._8_4_ = 0xbe7ffffc;
                          auVar67._0_8_ = 0xbe7ffffcbe7ffffc;
                          auVar67._12_4_ = 0xbe7ffffc;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar67);
                          auVar68._8_4_ = 0x3eaaaaaa;
                          auVar68._0_8_ = 0x3eaaaaaa3eaaaaaa;
                          auVar68._12_4_ = 0x3eaaaaaa;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar134,auVar68);
                          auVar202._0_4_ = auVar193._0_4_ * auVar134._0_4_ * auVar118._0_4_;
                          auVar202._4_4_ = auVar193._4_4_ * auVar134._4_4_ * auVar118._4_4_;
                          auVar202._8_4_ = auVar193._8_4_ * auVar134._8_4_ * auVar118._8_4_;
                          auVar202._12_4_ = auVar193._12_4_ * auVar134._12_4_ * auVar118._12_4_;
                          auVar69._8_4_ = 0x42b0c0a5;
                          auVar69._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar69._12_4_ = 0x42b0c0a5;
                          auVar118 = vfmadd231ps_fma(auVar202,auVar192,auVar92);
                          auVar208._8_4_ = 0x3f000000;
                          auVar208._0_8_ = 0x3f0000003f000000;
                          auVar208._12_4_ = 0x3f000000;
                          auVar96 = vfmsub231ps_fma(auVar118,auVar208,auVar193);
                          auVar118 = vcmpps_avx(auVar97,(undefined1  [16])0x0,2);
                          auVar96 = vsubps_avx(auVar96,auVar134);
                          auVar192 = vfnmadd231ps_fma(auVar96,auVar198,auVar192);
                          auVar135._0_4_ = auVar192._0_4_ + auVar192._0_4_;
                          auVar135._4_4_ = auVar192._4_4_ + auVar192._4_4_;
                          auVar135._8_4_ = auVar192._8_4_ + auVar192._8_4_;
                          auVar135._12_4_ = auVar192._12_4_ + auVar192._12_4_;
                          auVar155._8_4_ = 0x7fffffff;
                          auVar155._0_8_ = 0x7fffffff7fffffff;
                          auVar155._12_4_ = 0x7fffffff;
                          auVar118 = vblendvps_avx(auVar135,auVar155,auVar118);
                          auVar118 = vminps_avx(auVar118,auVar69);
                          auVar96 = vmaxps_avx(auVar210,auVar118);
                          auVar136._8_4_ = 0x3fb8aa3b;
                          auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar136._12_4_ = 0x3fb8aa3b;
                          auVar70._8_4_ = 0x3f000000;
                          auVar70._0_8_ = 0x3f0000003f000000;
                          auVar70._12_4_ = 0x3f000000;
                          auVar118 = vfmadd213ps_fma(auVar136,auVar96,auVar70);
                          auVar156._0_4_ = (int)auVar118._0_4_;
                          auVar156._4_4_ = (int)auVar118._4_4_;
                          auVar156._8_4_ = (int)auVar118._8_4_;
                          auVar156._12_4_ = (int)auVar118._12_4_;
                          auVar192 = vcvtdq2ps_avx(auVar156);
                          auVar118 = vcmpps_avx(auVar118,auVar192,1);
                          auVar118 = vandps_avx(auVar167,auVar118);
                          auVar118 = vsubps_avx(auVar192,auVar118);
                          auVar192 = vfmsub231ps_fma(auVar96,auVar118,auVar198);
                          auVar96 = vfnmsub231ps_fma(auVar192,auVar118,auVar92);
                          auVar93._8_4_ = 0x3f000000;
                          auVar93._0_8_ = 0x3f0000003f000000;
                          auVar93._12_4_ = 0x3f000000;
                          auVar100 = ZEXT1664(auVar93);
                          auVar157._0_4_ = auVar96._0_4_ * auVar96._0_4_;
                          auVar157._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                          auVar157._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                          auVar157._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                          auVar182 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          auVar71._8_4_ = 0x3ab743ce;
                          auVar71._0_8_ = 0x3ab743ce3ab743ce;
                          auVar71._12_4_ = 0x3ab743ce;
                          auVar192 = vfmadd213ps_fma(auVar168,auVar96,auVar71);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar184);
                          auVar72._8_4_ = 0x3d2aa9c1;
                          auVar72._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar72._12_4_ = 0x3d2aa9c1;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar72);
                          auVar73._8_4_ = 0x3e2aaaaa;
                          auVar73._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar73._12_4_ = 0x3e2aaaaa;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar73);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar93);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar157,auVar96);
                          auVar119._0_4_ = auVar192._0_4_ + 1.0;
                          auVar119._4_4_ = auVar192._4_4_ + 1.0;
                          auVar119._8_4_ = auVar192._8_4_ + 1.0;
                          auVar119._12_4_ = auVar192._12_4_ + 1.0;
                          auVar137._0_4_ = (int)auVar118._0_4_;
                          auVar137._4_4_ = (int)auVar118._4_4_;
                          auVar137._8_4_ = (int)auVar118._8_4_;
                          auVar137._12_4_ = (int)auVar118._12_4_;
                          auVar118 = vpslld_avx(auVar137,0x17);
                          auVar118 = vpaddd_avx(auVar167,auVar118);
                          auVar118 = vfmadd213ps_fma(auVar118,auVar119,auVar167);
                          auVar74._8_4_ = 0x40000000;
                          auVar74._0_8_ = 0x4000000040000000;
                          auVar74._12_4_ = 0x40000000;
                          auVar118 = vdivps_avx(auVar74,auVar118);
                          auVar102 = vfmsub231ps_fma(auVar102,auVar102,auVar118);
                          break;
                        case 5:
                          puVar35 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar44 = *puVar35;
                          auVar124._4_4_ = uVar44;
                          auVar124._0_4_ = uVar44;
                          auVar124._8_4_ = uVar44;
                          auVar124._12_4_ = uVar44;
                          uVar44 = puVar35[1];
                          auVar142._4_4_ = uVar44;
                          auVar142._0_4_ = uVar44;
                          auVar142._8_4_ = uVar44;
                          auVar142._12_4_ = uVar44;
                          auVar118 = vfmadd231ps_fma(auVar142,auVar102,auVar124);
                          auVar118 = vmaxps_avx(auVar118,(undefined1  [16])0x0);
                          auVar118 = vminps_avx(auVar167,auVar118);
                          auVar102._0_4_ = auVar118._0_4_ * auVar102._0_4_;
                          auVar102._4_4_ = auVar118._4_4_ * fVar43;
                          auVar102._8_4_ = auVar118._8_4_ * fVar54;
                          auVar102._12_4_ = auVar118._12_4_ * fVar1;
                        }
                        auVar118 = auVar100._0_16_;
                        fVar43 = auVar109._4_4_;
                        fVar54 = auVar109._8_4_;
                        fVar1 = auVar109._12_4_;
                        switch(iVar52) {
                        case 0:
                          auVar109 = vmaxps_avx(auVar109,(undefined1  [16])0x0);
                          break;
                        case 1:
                          auVar118 = vmaxps_avx(auVar109,(undefined1  [16])0x0);
                          auVar192 = vminps_avx(auVar109,(undefined1  [16])0x0);
                          uVar44 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar112._4_4_ = uVar44;
                          auVar112._0_4_ = uVar44;
                          auVar112._8_4_ = uVar44;
                          auVar112._12_4_ = uVar44;
                          auVar109 = vfmadd213ps_fma(auVar112,auVar192,auVar118);
                          break;
                        case 2:
                          puVar35 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar44 = *puVar35;
                          auVar127._4_4_ = uVar44;
                          auVar127._0_4_ = uVar44;
                          auVar127._8_4_ = uVar44;
                          auVar127._12_4_ = uVar44;
                          uVar44 = puVar35[1];
                          auVar147._4_4_ = uVar44;
                          auVar147._0_4_ = uVar44;
                          auVar147._8_4_ = uVar44;
                          auVar147._12_4_ = uVar44;
                          auVar118 = vmaxps_avx(auVar109,auVar127);
                          auVar109 = vminps_avx(auVar118,auVar147);
                          break;
                        case 3:
                          auVar110._0_4_ = auVar182._0_4_ ^ (uint)auVar109._0_4_;
                          auVar110._4_4_ = auVar182._4_4_ ^ (uint)fVar43;
                          auVar110._8_4_ = auVar182._8_4_ ^ (uint)fVar54;
                          auVar110._12_4_ = auVar182._12_4_ ^ (uint)fVar1;
                          auVar86._8_4_ = 0x42b0c0a5;
                          auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar86._12_4_ = 0x42b0c0a5;
                          auVar192 = vminps_avx(auVar110,auVar86);
                          auVar128._8_4_ = 0xc2b0c0a5;
                          auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar128._12_4_ = 0xc2b0c0a5;
                          auVar91 = vmaxps_avx(auVar192,auVar128);
                          auVar129._8_4_ = 0x3fb8aa3b;
                          auVar129._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar129._12_4_ = 0x3fb8aa3b;
                          auVar192 = vfmadd213ps_fma(auVar129,auVar91,auVar118);
                          auVar148._0_4_ = (int)auVar192._0_4_;
                          auVar148._4_4_ = (int)auVar192._4_4_;
                          auVar148._8_4_ = (int)auVar192._8_4_;
                          auVar148._12_4_ = (int)auVar192._12_4_;
                          auVar96 = vcvtdq2ps_avx(auVar148);
                          auVar192 = vcmpps_avx(auVar192,auVar96,1);
                          auVar192 = vandps_avx(auVar167,auVar192);
                          auVar192 = vsubps_avx(auVar96,auVar192);
                          auVar87._8_4_ = 0x3f318000;
                          auVar87._0_8_ = 0x3f3180003f318000;
                          auVar87._12_4_ = 0x3f318000;
                          auVar96 = vfmsub231ps_fma(auVar91,auVar192,auVar87);
                          auVar149._8_4_ = 0x395e8083;
                          auVar149._0_8_ = 0x395e8083395e8083;
                          auVar149._12_4_ = 0x395e8083;
                          auVar91 = vfmsub231ps_fma(auVar96,auVar192,auVar149);
                          auVar150._0_4_ = auVar91._0_4_ * auVar91._0_4_;
                          auVar150._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                          auVar150._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                          auVar150._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                          auVar166._8_4_ = 0x39506967;
                          auVar166._0_8_ = 0x3950696739506967;
                          auVar166._12_4_ = 0x39506967;
                          auVar187._8_4_ = 0x3ab743ce;
                          auVar187._0_8_ = 0x3ab743ce3ab743ce;
                          auVar187._12_4_ = 0x3ab743ce;
                          auVar96 = vfmadd213ps_fma(auVar166,auVar91,auVar187);
                          auVar88._8_4_ = 0x3c088908;
                          auVar88._0_8_ = 0x3c0889083c088908;
                          auVar88._12_4_ = 0x3c088908;
                          auVar96 = vfmadd213ps_fma(auVar96,auVar91,auVar88);
                          auVar89._8_4_ = 0x3d2aa9c1;
                          auVar89._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar89._12_4_ = 0x3d2aa9c1;
                          auVar96 = vfmadd213ps_fma(auVar96,auVar91,auVar89);
                          auVar90._8_4_ = 0x3e2aaaaa;
                          auVar90._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar90._12_4_ = 0x3e2aaaaa;
                          auVar96 = vfmadd213ps_fma(auVar96,auVar91,auVar90);
                          auVar118 = vfmadd213ps_fma(auVar96,auVar91,auVar118);
                          auVar118 = vfmadd213ps_fma(auVar118,auVar150,auVar91);
                          auVar111._0_4_ = auVar118._0_4_ + 1.0;
                          auVar111._4_4_ = auVar118._4_4_ + 1.0;
                          auVar111._8_4_ = auVar118._8_4_ + 1.0;
                          auVar111._12_4_ = auVar118._12_4_ + 1.0;
                          auVar130._0_4_ = (int)auVar192._0_4_;
                          auVar130._4_4_ = (int)auVar192._4_4_;
                          auVar130._8_4_ = (int)auVar192._8_4_;
                          auVar130._12_4_ = (int)auVar192._12_4_;
                          auVar118 = vpslld_avx(auVar130,0x17);
                          auVar118 = vpaddd_avx(auVar167,auVar118);
                          auVar118 = vfmadd213ps_fma(auVar118,auVar111,auVar167);
                          auVar109 = vdivps_avx(auVar167,auVar118);
                          break;
                        case 4:
                          auVar80._8_4_ = 0x42b0c0a5;
                          auVar80._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar80._12_4_ = 0x42b0c0a5;
                          auVar192 = vminps_avx(auVar109,auVar80);
                          auVar211._8_4_ = 0xc2b0c0a5;
                          auVar211._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar211._12_4_ = 0xc2b0c0a5;
                          auVar96 = vmaxps_avx(auVar211,auVar192);
                          auVar199._8_4_ = 0x3fb8aa3b;
                          auVar199._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar199._12_4_ = 0x3fb8aa3b;
                          auVar118 = vfmadd213ps_fma(auVar199,auVar96,auVar118);
                          auVar159._0_4_ = (int)auVar118._0_4_;
                          auVar159._4_4_ = (int)auVar118._4_4_;
                          auVar159._8_4_ = (int)auVar118._8_4_;
                          auVar159._12_4_ = (int)auVar118._12_4_;
                          auVar192 = vcvtdq2ps_avx(auVar159);
                          auVar118 = vcmpps_avx(auVar118,auVar192,1);
                          auVar118 = vandps_avx(auVar167,auVar118);
                          auVar118 = vsubps_avx(auVar192,auVar118);
                          auVar81._8_4_ = 0x3f318000;
                          auVar81._0_8_ = 0x3f3180003f318000;
                          auVar81._12_4_ = 0x3f318000;
                          auVar192 = vfmsub231ps_fma(auVar96,auVar118,auVar81);
                          auVar94._8_4_ = 0xb95e8083;
                          auVar94._0_8_ = 0xb95e8083b95e8083;
                          auVar94._12_4_ = 0xb95e8083;
                          auVar96 = vfnmsub231ps_fma(auVar192,auVar118,auVar94);
                          auVar160._0_4_ = auVar96._0_4_ * auVar96._0_4_;
                          auVar160._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                          auVar160._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                          auVar160._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                          auVar195._8_4_ = 0x39506967;
                          auVar195._0_8_ = 0x3950696739506967;
                          auVar195._12_4_ = 0x39506967;
                          auVar185._8_4_ = 0x3ab743ce;
                          auVar185._0_8_ = 0x3ab743ce3ab743ce;
                          auVar185._12_4_ = 0x3ab743ce;
                          auVar192 = vfmadd213ps_fma(auVar195,auVar96,auVar185);
                          auVar186._8_4_ = 0x3c088908;
                          auVar186._0_8_ = 0x3c0889083c088908;
                          auVar186._12_4_ = 0x3c088908;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar186);
                          auVar203._8_4_ = 0x3d2aa9c1;
                          auVar203._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar203._12_4_ = 0x3d2aa9c1;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar203);
                          auVar204._8_4_ = 0x3e2aaaaa;
                          auVar204._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar204._12_4_ = 0x3e2aaaaa;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar204);
                          auVar205._8_4_ = 0x3f000000;
                          auVar205._0_8_ = 0x3f0000003f000000;
                          auVar205._12_4_ = 0x3f000000;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar205);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar160,auVar96);
                          auVar161._0_4_ = auVar192._0_4_ + 1.0;
                          auVar161._4_4_ = auVar192._4_4_ + 1.0;
                          auVar161._8_4_ = auVar192._8_4_ + 1.0;
                          auVar161._12_4_ = auVar192._12_4_ + 1.0;
                          auVar125._0_4_ = (int)auVar118._0_4_;
                          auVar125._4_4_ = (int)auVar118._4_4_;
                          auVar125._8_4_ = (int)auVar118._8_4_;
                          auVar125._12_4_ = (int)auVar118._12_4_;
                          auVar118 = vpslld_avx(auVar125,0x17);
                          auVar118 = vpaddd_avx(auVar167,auVar118);
                          auVar97 = vfmadd213ps_fma(auVar118,auVar161,auVar167);
                          auVar143._8_4_ = 0x800000;
                          auVar143._0_8_ = 0x80000000800000;
                          auVar143._12_4_ = 0x800000;
                          auVar118 = vmaxps_avx(auVar97,auVar143);
                          auVar192 = vpsrld_avx(auVar118,0x17);
                          auVar169._8_4_ = 0x807fffff;
                          auVar169._0_8_ = 0x807fffff807fffff;
                          auVar169._12_4_ = 0x807fffff;
                          auVar118 = vandps_avx(auVar169,auVar118);
                          auVar170._8_4_ = 0x3f000000;
                          auVar170._0_8_ = 0x3f0000003f000000;
                          auVar170._12_4_ = 0x3f000000;
                          auVar91 = vorps_avx(auVar170,auVar118);
                          auVar171._8_4_ = 0xffffff82;
                          auVar171._0_8_ = 0xffffff82ffffff82;
                          auVar171._12_4_ = 0xffffff82;
                          auVar118 = vpaddd_avx(auVar171,auVar192);
                          auVar96 = vcvtdq2ps_avx(auVar118);
                          auVar172._8_4_ = 0x3f3504f3;
                          auVar172._0_8_ = 0x3f3504f33f3504f3;
                          auVar172._12_4_ = 0x3f3504f3;
                          auVar192 = vcmpps_avx(auVar91,auVar172,1);
                          auVar118 = vandps_avx(auVar192,auVar91);
                          auVar144._0_4_ = auVar118._0_4_ + auVar91._0_4_ + -1.0;
                          auVar144._4_4_ = auVar118._4_4_ + auVar91._4_4_ + -1.0;
                          auVar144._8_4_ = auVar118._8_4_ + auVar91._8_4_ + -1.0;
                          auVar144._12_4_ = auVar118._12_4_ + auVar91._12_4_ + -1.0;
                          auVar118 = vandps_avx(auVar192,auVar167);
                          auVar192 = vsubps_avx(auVar96,auVar118);
                          auVar196._0_4_ = auVar144._0_4_ * auVar144._0_4_;
                          auVar196._4_4_ = auVar144._4_4_ * auVar144._4_4_;
                          auVar196._8_4_ = auVar144._8_4_ * auVar144._8_4_;
                          auVar196._12_4_ = auVar144._12_4_ * auVar144._12_4_;
                          auVar206._8_4_ = 0x3d9021bb;
                          auVar206._0_8_ = 0x3d9021bb3d9021bb;
                          auVar206._12_4_ = 0x3d9021bb;
                          auVar173._8_4_ = 0xbdebd1b8;
                          auVar173._0_8_ = 0xbdebd1b8bdebd1b8;
                          auVar173._12_4_ = 0xbdebd1b8;
                          auVar118 = vfmadd213ps_fma(auVar206,auVar144,auVar173);
                          auVar174._8_4_ = 0x3def251a;
                          auVar174._0_8_ = 0x3def251a3def251a;
                          auVar174._12_4_ = 0x3def251a;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar174);
                          auVar175._8_4_ = 0xbdfe5d4f;
                          auVar175._0_8_ = 0xbdfe5d4fbdfe5d4f;
                          auVar175._12_4_ = 0xbdfe5d4f;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar175);
                          auVar176._8_4_ = 0x3e11e9bf;
                          auVar176._0_8_ = 0x3e11e9bf3e11e9bf;
                          auVar176._12_4_ = 0x3e11e9bf;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar176);
                          auVar177._8_4_ = 0xbe2aae50;
                          auVar177._0_8_ = 0xbe2aae50be2aae50;
                          auVar177._12_4_ = 0xbe2aae50;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar177);
                          auVar178._8_4_ = 0x3e4cceac;
                          auVar178._0_8_ = 0x3e4cceac3e4cceac;
                          auVar178._12_4_ = 0x3e4cceac;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar178);
                          auVar179._8_4_ = 0xbe7ffffc;
                          auVar179._0_8_ = 0xbe7ffffcbe7ffffc;
                          auVar179._12_4_ = 0xbe7ffffc;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar179);
                          auVar180._8_4_ = 0x3eaaaaaa;
                          auVar180._0_8_ = 0x3eaaaaaa3eaaaaaa;
                          auVar180._12_4_ = 0x3eaaaaaa;
                          auVar118 = vfmadd213ps_fma(auVar118,auVar144,auVar180);
                          auVar207._0_4_ = auVar196._0_4_ * auVar144._0_4_ * auVar118._0_4_;
                          auVar207._4_4_ = auVar196._4_4_ * auVar144._4_4_ * auVar118._4_4_;
                          auVar207._8_4_ = auVar196._8_4_ * auVar144._8_4_ * auVar118._8_4_;
                          auVar207._12_4_ = auVar196._12_4_ * auVar144._12_4_ * auVar118._12_4_;
                          auVar209._8_4_ = 0x42b0c0a5;
                          auVar209._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar209._12_4_ = 0x42b0c0a5;
                          auVar118 = vfmadd231ps_fma(auVar207,auVar192,auVar94);
                          auVar181._8_4_ = 0x3f000000;
                          auVar181._0_8_ = 0x3f0000003f000000;
                          auVar181._12_4_ = 0x3f000000;
                          auVar96 = vfmsub231ps_fma(auVar118,auVar181,auVar196);
                          auVar118 = vcmpps_avx(auVar97,(undefined1  [16])0x0,2);
                          auVar96 = vsubps_avx(auVar96,auVar144);
                          auVar192 = vfnmadd231ps_fma(auVar96,auVar81,auVar192);
                          auVar145._0_4_ = auVar192._0_4_ + auVar192._0_4_;
                          auVar145._4_4_ = auVar192._4_4_ + auVar192._4_4_;
                          auVar145._8_4_ = auVar192._8_4_ + auVar192._8_4_;
                          auVar145._12_4_ = auVar192._12_4_ + auVar192._12_4_;
                          auVar162._8_4_ = 0x7fffffff;
                          auVar162._0_8_ = 0x7fffffff7fffffff;
                          auVar162._12_4_ = 0x7fffffff;
                          auVar118 = vblendvps_avx(auVar145,auVar162,auVar118);
                          auVar118 = vminps_avx(auVar209,auVar118);
                          auVar96 = vmaxps_avx(auVar211,auVar118);
                          auVar163._8_4_ = 0x3f000000;
                          auVar163._0_8_ = 0x3f0000003f000000;
                          auVar163._12_4_ = 0x3f000000;
                          auVar118 = vfmadd213ps_fma(auVar199,auVar96,auVar163);
                          auVar164._0_4_ = (int)auVar118._0_4_;
                          auVar164._4_4_ = (int)auVar118._4_4_;
                          auVar164._8_4_ = (int)auVar118._8_4_;
                          auVar164._12_4_ = (int)auVar118._12_4_;
                          auVar192 = vcvtdq2ps_avx(auVar164);
                          auVar118 = vcmpps_avx(auVar118,auVar192,1);
                          auVar118 = vandps_avx(auVar167,auVar118);
                          auVar118 = vsubps_avx(auVar192,auVar118);
                          auVar192 = vfmsub231ps_fma(auVar96,auVar118,auVar81);
                          auVar96 = vfnmsub231ps_fma(auVar192,auVar118,auVar94);
                          auVar95._8_4_ = 0x3f000000;
                          auVar95._0_8_ = 0x3f0000003f000000;
                          auVar95._12_4_ = 0x3f000000;
                          auVar100 = ZEXT1664(auVar95);
                          auVar165._0_4_ = auVar96._0_4_ * auVar96._0_4_;
                          auVar165._4_4_ = auVar96._4_4_ * auVar96._4_4_;
                          auVar165._8_4_ = auVar96._8_4_ * auVar96._8_4_;
                          auVar165._12_4_ = auVar96._12_4_ * auVar96._12_4_;
                          auVar197._8_4_ = 0x39506967;
                          auVar197._0_8_ = 0x3950696739506967;
                          auVar197._12_4_ = 0x39506967;
                          auVar182 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          auVar82._8_4_ = 0x3ab743ce;
                          auVar82._0_8_ = 0x3ab743ce3ab743ce;
                          auVar82._12_4_ = 0x3ab743ce;
                          auVar192 = vfmadd213ps_fma(auVar197,auVar96,auVar82);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar186);
                          auVar83._8_4_ = 0x3d2aa9c1;
                          auVar83._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar83._12_4_ = 0x3d2aa9c1;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar83);
                          auVar84._8_4_ = 0x3e2aaaaa;
                          auVar84._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar84._12_4_ = 0x3e2aaaaa;
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar84);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar96,auVar95);
                          auVar192 = vfmadd213ps_fma(auVar192,auVar165,auVar96);
                          auVar126._0_4_ = auVar192._0_4_ + 1.0;
                          auVar126._4_4_ = auVar192._4_4_ + 1.0;
                          auVar126._8_4_ = auVar192._8_4_ + 1.0;
                          auVar126._12_4_ = auVar192._12_4_ + 1.0;
                          auVar146._0_4_ = (int)auVar118._0_4_;
                          auVar146._4_4_ = (int)auVar118._4_4_;
                          auVar146._8_4_ = (int)auVar118._8_4_;
                          auVar146._12_4_ = (int)auVar118._12_4_;
                          auVar118 = vpslld_avx(auVar146,0x17);
                          auVar118 = vpaddd_avx(auVar167,auVar118);
                          auVar118 = vfmadd213ps_fma(auVar118,auVar126,auVar167);
                          auVar85._8_4_ = 0x40000000;
                          auVar85._0_8_ = 0x4000000040000000;
                          auVar85._12_4_ = 0x40000000;
                          auVar118 = vdivps_avx(auVar85,auVar118);
                          auVar109 = vfmsub231ps_fma(auVar109,auVar109,auVar118);
                          break;
                        case 5:
                          puVar35 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar44 = *puVar35;
                          auVar131._4_4_ = uVar44;
                          auVar131._0_4_ = uVar44;
                          auVar131._8_4_ = uVar44;
                          auVar131._12_4_ = uVar44;
                          uVar44 = puVar35[1];
                          auVar151._4_4_ = uVar44;
                          auVar151._0_4_ = uVar44;
                          auVar151._8_4_ = uVar44;
                          auVar151._12_4_ = uVar44;
                          auVar118 = vfmadd231ps_fma(auVar151,auVar109,auVar131);
                          auVar118 = vmaxps_avx(auVar118,(undefined1  [16])0x0);
                          auVar118 = vminps_avx(auVar167,auVar118);
                          auVar109._0_4_ = auVar118._0_4_ * auVar109._0_4_;
                          auVar109._4_4_ = auVar118._4_4_ * fVar43;
                          auVar109._8_4_ = auVar118._8_4_ * fVar54;
                          auVar109._12_4_ = auVar118._12_4_ * fVar1;
                        }
                        if (iVar31 < 0x65) {
                          *pauVar48 = auVar102;
                          pauVar48[1] = auVar109;
                          pauVar48 = pauVar48 + 2;
                        }
                        else {
                          pvVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                          pfVar51 = (float *)((long)pvVar5 + local_308 * 0x20);
                          auVar106._0_4_ = auVar102._0_4_ * *pfVar51;
                          auVar106._4_4_ = auVar102._4_4_ * pfVar51[1];
                          auVar106._8_4_ = auVar102._8_4_ * pfVar51[2];
                          auVar106._12_4_ = auVar102._12_4_ * pfVar51[3];
                          pfVar51 = (float *)((long)pvVar5 + local_308 * 0x20 + 0x10);
                          auVar113._0_4_ = auVar109._0_4_ * *pfVar51;
                          auVar113._4_4_ = auVar109._4_4_ * pfVar51[1];
                          auVar113._8_4_ = auVar109._8_4_ * pfVar51[2];
                          auVar113._12_4_ = auVar109._12_4_ * pfVar51[3];
                          auVar118 = vandps_avx(auVar182._0_16_,auVar106);
                          auVar192 = vandps_avx(auVar182._0_16_,auVar113);
                          auVar118 = vorps_avx(auVar118,auVar100._0_16_);
                          auVar192 = vorps_avx(auVar192,auVar100._0_16_);
                          auVar107._0_4_ = (int)(auVar106._0_4_ + auVar118._0_4_);
                          auVar107._4_4_ = (int)(auVar106._4_4_ + auVar118._4_4_);
                          auVar107._8_4_ = (int)(auVar106._8_4_ + auVar118._8_4_);
                          auVar107._12_4_ = (int)(auVar106._12_4_ + auVar118._12_4_);
                          auVar114._0_4_ = (int)(auVar113._0_4_ + auVar192._0_4_);
                          auVar114._4_4_ = (int)(auVar113._4_4_ + auVar192._4_4_);
                          auVar114._8_4_ = (int)(auVar113._8_4_ + auVar192._8_4_);
                          auVar114._12_4_ = (int)(auVar113._12_4_ + auVar192._12_4_);
                          auVar118 = vpackssdw_avx(auVar107,auVar114);
                          auVar118 = vpminsw_avx(auVar118,_DAT_005fa420);
                          auVar118 = vpmaxsw_avx(auVar118,_DAT_005fa430);
                          auVar118 = vpacksswb_avx(auVar118,auVar118);
                          *(long *)*pauVar49 = auVar118._0_8_;
                          pauVar49 = (undefined1 (*) [16])((long)*pauVar49 + 8);
                        }
                        bVar53 = iVar42 != iVar40;
                        iVar42 = iVar42 + 1;
                      } while (bVar53);
                    }
                    uVar41 = (ulong)(iVar50 + 1);
                  } while (iVar50 != (int)local_1d0);
                }
                local_308 = local_308 + 1;
                local_290 = (ulong)(uint)((int)local_290 + (int)uVar38 * 8);
                local_1d8 = uVar36;
              } while (local_308 != uVar36);
            }
            if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2e8._0_8_,
                              CONCAT44(local_2e8._20_4_,local_2e8._16_4_) - local_2e8._0_8_);
            }
          }
          local_320 = 0;
          local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
        }
      }
    }
    else {
      iVar40 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar38 = 1;
      if (opt->use_packing_layout == true) {
        uVar46 = (this->super_ConvolutionDepthWise).num_output;
        if (iVar40 < 0x65) {
          uVar38 = (ulong)((uint)((uVar46 & 3) == 0) * 3 + 1);
        }
        else {
          uVar38 = 1;
          if ((uVar46 & 7) == 0) {
            uVar38 = 8;
          }
        }
      }
      local_320 = -100;
      uVar46 = (uint)uVar38;
      uVar36 = (ulong)(uVar46 * 4);
      if (100 < iVar40) {
        uVar36 = uVar38;
      }
      local_288 = CONCAT44(local_288._4_4_,iVar50);
      Mat::create(top_blob,iVar42,iVar50,(this->super_ConvolutionDepthWise).num_output / (int)uVar46
                  ,uVar36,uVar46,opt->blob_allocator);
      auVar27 = local_2c8;
      local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
      if ((top_blob->data != (void *)0x0) &&
         (local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_),
         (long)top_blob->c * top_blob->cstep != 0)) {
        iVar50 = (this->super_ConvolutionDepthWise).group;
        uVar39 = (int)uVar39 / iVar50;
        uVar30 = (this->super_ConvolutionDepthWise).num_output / iVar50;
        local_298 = (float *)CONCAT44(local_298._4_4_,uVar30);
        iVar50 = 1;
        _elempack = 1;
        if (opt->use_packing_layout == true) {
          iVar50 = 1;
          if ((uVar39 & 7) == 0) {
            iVar50 = 8;
          }
          if (iVar40 < 0x65) {
            _elempack = (uint)((uVar30 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack = 1;
            if ((uVar30 & 7) == 0) {
              _elempack = 8;
            }
          }
        }
        piVar3 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
        local_2e8._0_8_ = local_278.data;
        local_2e8._8_4_ = local_278.refcount._0_4_;
        local_2e8._12_4_ = local_278.refcount._4_4_;
        local_2e8._16_4_ = (undefined4)local_278.elemsize;
        local_2e8._20_4_ = (undefined4)(local_278.elemsize >> 0x20);
        local_2e8._24_4_ = local_278.elempack;
        local_2c8._12_4_ = local_278.w;
        local_2c8._8_4_ = local_278.dims;
        local_2c8._20_4_ = local_278.d;
        local_2c8._16_4_ = local_278.h;
        local_2c8._0_8_ = local_278.allocator;
        local_2c8._28_4_ = auVar27._28_4_;
        local_2c8._24_4_ = local_278.c;
        local_2a8 = local_278.cstep;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        if (iVar50 < iVar52) {
          local_228.data = *(void **)opt;
          uVar18 = opt->openmp_blocktime;
          uVar19 = opt->use_winograd_convolution;
          uVar21 = opt->use_sgemm_convolution;
          uVar23 = opt->use_int8_inference;
          uVar25 = opt->use_vulkan_compute;
          uVar24 = CONCAT11(uVar25,uVar23);
          uVar22 = CONCAT21(uVar24,uVar21);
          uVar20 = CONCAT31(uVar22,uVar19);
          local_228.allocator = *(Allocator **)&opt->use_bf16_storage;
          local_228._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
          local_228._48_8_ = *(undefined8 *)&opt->flush_denormals;
          local_228.c._0_1_ = opt->use_winograd43_convolution;
          local_228.c._1_1_ = opt->use_winograd63_convolution;
          local_228.c._2_1_ = opt->use_a53_a55_optimized_kernel;
          local_228.c._3_1_ = opt->use_fp16_uniform;
          local_228._60_1_ = opt->use_int8_uniform;
          local_228._61_1_ = opt->use_reserved_9;
          local_228._62_1_ = opt->use_reserved_10;
          local_228._63_1_ = opt->use_reserved_11;
          local_228.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
          local_228.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          local_228.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
          local_228.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          local_228.elempack = uVar18;
          local_228._28_4_ = uVar20;
          convert_packing(&local_278,(Mat *)local_2e8,iVar50,(Option *)&local_228);
          if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
            if ((long)(int)local_2c8._24_4_ * local_2a8 != 0) goto LAB_0041f182;
          }
          local_320 = -100;
        }
        else {
LAB_0041f182:
          piVar3 = top_blob->refcount;
          local_228.data = top_blob->data;
          local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
          local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
          local_228.elemsize._0_4_ = (undefined4)top_blob->elemsize;
          local_228.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
          local_228.elempack = top_blob->elempack;
          local_228.allocator = top_blob->allocator;
          local_228.dims = top_blob->dims;
          local_228.w = top_blob->w;
          local_228.h = top_blob->h;
          local_228.d = top_blob->d;
          local_228.c = top_blob->c;
          local_228.cstep = top_blob->cstep;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          if (_elempack < uVar46) {
            Mat::create(&local_228,iVar42,(int)local_288,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack,
                        (ulong)((int)(uVar36 / uVar38) * _elempack),_elempack,
                        opt->workspace_allocator);
            local_320 = -100;
            if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0))
            goto LAB_0041f258;
          }
          else {
LAB_0041f258:
            iVar40 = (this->super_ConvolutionDepthWise).group;
            bVar53 = 0 < iVar40;
            if (iVar40 < 1) {
              local_320 = -100;
            }
            else {
              local_288 = CONCAT44(local_288._4_4_,(int)uVar39 / iVar50);
              local_290 = CONCAT44(local_290._4_4_,(int)local_298 / (int)_elempack);
              local_320 = -100;
              iVar40 = 0;
              iVar42 = 0;
              lVar33 = 0;
              do {
                auVar27 = local_2c8;
                local_138 = CONCAT44(local_2e8._20_4_,local_2e8._16_4_);
                local_178 = (pointer)((long)(iVar40 / iVar50) * local_2a8 * local_138 +
                                     local_2e8._0_8_);
                uStack_170 = 0;
                uStack_16c = 0;
                local_168 = local_2e8._16_4_;
                uStack_164 = local_2e8._20_4_;
                local_160 = local_2e8._24_4_;
                local_158 = (Allocator *)local_2c8._0_8_;
                local_140 = (int)local_288;
                uVar26 = local_2c8._8_8_;
                uVar28 = local_2c8._16_8_;
                local_138 = ((long)(int)local_2c8._20_4_ * local_138 *
                             (long)(int)local_2c8._16_4_ * (long)(int)local_2c8._12_4_ + 0xf &
                            0xfffffffffffffff0) / local_138;
                local_2c8._8_4_ = (undefined4)uVar26;
                local_2c8._12_4_ = SUB84(uVar26,4);
                local_150._0_4_ = local_2c8._8_4_;
                local_150._4_4_ = local_2c8._12_4_;
                local_2c8._16_4_ = (undefined4)uVar28;
                local_2c8._20_4_ = SUB84(uVar28,4);
                uStack_148._0_4_ = local_2c8._16_4_;
                uStack_148._4_4_ = local_2c8._20_4_;
                local_e8 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                local_128 = (void *)((long)(iVar42 / (int)_elempack) * local_228.cstep * local_e8 +
                                    (long)local_228.data);
                uStack_120 = 0;
                uStack_11c = 0;
                local_118 = (undefined4)local_228.elemsize;
                uStack_114 = local_228.elemsize._4_4_;
                local_110 = local_228.elempack;
                local_108 = local_228.allocator;
                local_f0 = (int)local_290;
                local_e8 = ((long)local_228.d * local_e8 * (long)local_228.h * (long)local_228.w +
                            0xf & 0xfffffffffffffff0) / local_e8;
                local_100._0_4_ = local_228.dims;
                local_100._4_4_ = local_228.w;
                uStack_f8._0_4_ = local_228.h;
                uStack_f8._4_4_ = local_228.d;
                pLVar9 = (this->group_ops).
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar33];
                local_78._0_1_ = opt->lightmode;
                local_78._1_1_ = opt->use_shader_pack8;
                local_78._2_1_ = opt->use_subgroup_ops;
                local_78._3_1_ = opt->use_reserved_0;
                local_78._4_4_ = opt->num_threads;
                pAStack_68 = opt->workspace_allocator;
                uStack_60._0_4_ = opt->openmp_blocktime;
                uStack_60._4_1_ = opt->use_winograd_convolution;
                uStack_60._5_1_ = opt->use_sgemm_convolution;
                uStack_60._6_1_ = opt->use_int8_inference;
                uStack_60._7_1_ = opt->use_vulkan_compute;
                local_58._0_1_ = opt->use_bf16_storage;
                local_58._1_1_ = opt->use_fp16_packed;
                local_58._2_1_ = opt->use_fp16_storage;
                local_58._3_1_ = opt->use_fp16_arithmetic;
                local_58._4_1_ = opt->use_int8_packed;
                local_58._5_1_ = opt->use_int8_storage;
                local_58._6_1_ = opt->use_int8_arithmetic;
                local_58._7_1_ = opt->use_packing_layout;
                uStack_50._0_4_ = opt->vulkan_device_index;
                uStack_50._4_1_ = opt->use_reserved_1;
                uStack_50._5_1_ = opt->use_image_storage;
                uStack_50._6_1_ = opt->use_tensor_storage;
                uStack_50._7_1_ = opt->use_reserved_2;
                uStack_48._0_4_ = opt->flush_denormals;
                uStack_48._4_1_ = opt->use_local_pool_allocator;
                uStack_48._5_1_ = opt->use_shader_local_memory;
                uStack_48._6_1_ = opt->use_cooperative_matrix;
                uStack_48._7_1_ = opt->use_winograd23_convolution;
                uStack_40._0_1_ = opt->use_winograd43_convolution;
                uStack_40._1_1_ = opt->use_winograd63_convolution;
                uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
                uStack_40._3_1_ = opt->use_fp16_uniform;
                uStack_40._4_1_ = opt->use_int8_uniform;
                uStack_40._5_1_ = opt->use_reserved_9;
                uStack_40._6_1_ = opt->use_reserved_10;
                uStack_40._7_1_ = opt->use_reserved_11;
                pAStack_70 = local_228.allocator;
                local_2c8 = auVar27;
                iVar31 = (*pLVar9->_vptr_Layer[7])(pLVar9,&local_178,&local_128,&local_78);
                if (iVar31 != 0) {
                  local_320 = iVar31;
                }
                piVar3 = (int *)CONCAT44(uStack_11c,uStack_120);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    if (local_108 == (Allocator *)0x0) {
                      if (local_128 != (void *)0x0) {
                        free(local_128);
                      }
                    }
                    else {
                      (*local_108->_vptr_Allocator[3])();
                    }
                  }
                }
                local_e8 = 0;
                local_128 = (void *)0x0;
                uStack_120 = 0;
                uStack_11c = 0;
                local_118 = 0;
                uStack_114 = 0;
                local_110 = 0;
                local_100 = 0;
                uStack_f8 = 0;
                local_f0 = 0;
                piVar3 = (int *)CONCAT44(uStack_16c,uStack_170);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    if (local_158 == (Allocator *)0x0) {
                      if (local_178 != (pointer)0x0) {
                        free(local_178);
                      }
                    }
                    else {
                      (*local_158->_vptr_Allocator[3])();
                    }
                  }
                }
                local_138 = 0;
                local_178 = (pointer)0x0;
                uStack_170 = 0;
                uStack_16c = 0;
                local_168 = 0;
                uStack_164 = 0;
                local_160 = 0;
                local_150 = 0;
                uStack_148 = 0;
                local_140 = 0;
                if (iVar31 != 0) break;
                lVar33 = lVar33 + 1;
                lVar45 = (long)(this->super_ConvolutionDepthWise).group;
                iVar42 = iVar42 + (int)local_298;
                iVar40 = iVar40 + uVar39;
                bVar53 = lVar33 < lVar45;
              } while (lVar33 < lVar45);
            }
            if (!bVar53) {
              if (_elempack < uVar46) {
                convert_packing(&local_228,top_blob,uVar46,opt);
                local_320 = -100;
                if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                goto LAB_0041ff15;
              }
              else if (&local_228 != top_blob) {
                piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
                piVar3 = top_blob->refcount;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    if (top_blob->allocator == (Allocator *)0x0) {
                      if (top_blob->data != (void *)0x0) {
                        free(top_blob->data);
                      }
                    }
                    else {
                      (*top_blob->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                top_blob->cstep = 0;
                top_blob->data = (void *)0x0;
                top_blob->refcount = (int *)0x0;
                *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
                *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
                top_blob->dims = 0;
                top_blob->w = 0;
                top_blob->h = 0;
                top_blob->d = 0;
                top_blob->c = 0;
                top_blob->data = local_228.data;
                top_blob->refcount =
                     (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                top_blob->elemsize =
                     CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                top_blob->elempack = local_228.elempack;
                top_blob->allocator = local_228.allocator;
                top_blob->dims = local_228.dims;
                top_blob->w = local_228.w;
                top_blob->h = local_228.h;
                top_blob->d = local_228.d;
                top_blob->c = local_228.c;
                top_blob->cstep = local_228.cstep;
              }
              local_320 = 0;
            }
          }
LAB_0041ff15:
          piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_228.allocator == (Allocator *)0x0) {
                if (local_228.data != (void *)0x0) {
                  free(local_228.data);
                }
              }
              else {
                (*(local_228.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_228.cstep = 0;
          local_228.data = (void *)0x0;
          local_228.refcount._0_4_ = 0;
          local_228.refcount._4_4_ = 0;
          local_228.elemsize._0_4_ = 0;
          local_228.elemsize._4_4_ = 0;
          local_228.elempack = 0;
          local_228.dims = 0;
          local_228.w = 0;
          local_228.h = 0;
          local_228.d = 0;
          local_228._56_8_ = local_228._56_8_ & 0xffffffff00000000;
        }
        piVar3 = (int *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if ((Allocator *)local_2c8._0_8_ == (Allocator *)0x0) {
              if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
                free((void *)local_2e8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_2c8._0_8_)[3])();
            }
          }
        }
        local_2a8 = 0;
        local_2e8._0_8_ = (pointer)0x0;
        local_2e8._8_8_ = (Allocator *)0x0;
        local_2e8._16_4_ = 0;
        local_2e8._20_4_ = 0;
        local_2e8._24_4_ = 0;
        local_2c8._0_28_ = ZEXT828((ulong)local_2c8._0_8_);
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if ((pointer)local_278.data != (pointer)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0041ef0e:
  local_278.cstep = 0;
  local_278.c = 0;
  local_278.d = 0;
  local_278.h = 0;
  local_278.w = 0;
  local_278.dims = 0;
  local_278.elempack = 0;
  local_278.elemsize = 0;
  local_278.refcount._4_4_ = 0;
  local_278.refcount._0_4_ = 0;
  local_278.data = (void *)0x0;
  piVar3 = (int *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_1c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1c8._0_8_ != (void *)0x0) {
          free((void *)local_1c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1c8._32_8_)[3])();
      }
    }
  }
  return local_320;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}